

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadlock_test.cpp
# Opt level: O2

void __thiscall
CheckedMutexTest_SimultaneousDeadlock_Test<yamc::checked::timed_mutex>::
~CheckedMutexTest_SimultaneousDeadlock_Test
          (CheckedMutexTest_SimultaneousDeadlock_Test<yamc::checked::timed_mutex> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, SimultaneousDeadlock)
{
  auto test_body = []{
    constexpr size_t NPAIRS = 4;
    yamc::test::barrier step(NPAIRS * 2);
    TypeParam mtx[NPAIRS * 2];
    yamc::test::task_runner(NPAIRS * 2, [&](std::size_t id) {
      TypeParam& mtx1 = mtx[id % NPAIRS];
      TypeParam& mtx2 = mtx[id % NPAIRS + NPAIRS];
      if (id < NPAIRS) {
        ASSERT_NO_THROW(mtx1.lock());
        step.await();
        EXPECT_NO_THROW(mtx2.lock());
        EXPECT_NO_THROW(mtx2.unlock());
        EXPECT_NO_THROW(mtx1.unlock());
      } else {
        ASSERT_NO_THROW(mtx2.lock());
        step.await();
        WAIT_TICKS;
        EXPECT_CHECK_FAILURE_INNER({
          mtx1.lock();
        });
        EXPECT_NO_THROW(mtx2.unlock());
      }
    });
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}